

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *containing_type,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte bVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [8];
  _Alloc_hider _Var5;
  ushort *p_00;
  bool bVar6;
  int iVar7;
  MessageLite *pMVar8;
  ushort *p_01;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long lVar10;
  uint uVar11;
  uint32 res;
  uint uVar12;
  uint uVar13;
  string *extension_00;
  ExtensionSet *pEVar14;
  ExtensionSet *unaff_R13;
  uint field_number;
  bool bVar15;
  StringPiece val;
  pair<const_char_*,_int> pVar16;
  pair<const_char_*,_unsigned_int> pVar17;
  undefined1 local_120 [8];
  ParseContext tmp_ctx;
  ExtensionInfo extension;
  char *p;
  undefined1 local_80 [8];
  string payload;
  bool local_41;
  ushort *puStack_40;
  bool was_packed_on_wire;
  char *ptr_local;
  ExtensionSet *this_00;
  
  local_80 = (undefined1  [8])&payload._M_string_length;
  payload._M_dataplus._M_p = (pointer)0x0;
  payload._M_string_length._0_1_ = 0;
  field_number = 0;
  payload.field_2._8_8_ = containing_type;
  puStack_40 = (ushort *)ptr;
  do {
    bVar6 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffc0,
                       ctx->group_depth_);
    p_00 = puStack_40;
    if (bVar6) {
      ptr_local = (char *)puStack_40;
      break;
    }
    p_01 = (ushort *)((long)puStack_40 + 1);
    pEVar14 = unaff_R13;
    if ((byte)*puStack_40 == 0x1a) {
      if (field_number == 0) {
        bVar1 = *(byte *)p_01;
        if ((char)bVar1 < '\0') {
          puStack_40 = p_01;
          pVar16 = ReadSizeFallback((char *)p_01,(uint)bVar1);
          auVar2 = pVar16._0_12_;
        }
        else {
          auVar2[8] = bVar1;
          auVar2._0_8_ = puStack_40 + 1;
          auVar2._9_3_ = 0;
        }
        puStack_40 = auVar2._0_8_;
        field_number = 0;
        if (puStack_40 == (ushort *)0x0) {
          bVar6 = false;
          puStack_40 = (ushort *)0x0;
          ptr_local = (char *)(ushort *)0x0;
        }
        else {
          puStack_40 = (ushort *)
                       EpsCopyInputStream::ReadString
                                 (&ctx->super_EpsCopyInputStream,(char *)puStack_40,auVar2._8_4_,
                                  (string *)local_80);
          bVar6 = puStack_40 != (ushort *)0x0;
          if (!bVar6) {
            ptr_local = (char *)puStack_40;
          }
        }
        bVar15 = false;
        if (bVar6) goto LAB_0014b258;
      }
      else {
        puStack_40 = p_01;
        puStack_40 = (ushort *)
                     ParseField(this,(ulong)field_number * 8 + 2,(char *)p_01,
                                (MessageLite *)payload.field_2._8_8_,metadata,ctx);
        if (puStack_40 != (ushort *)0x0) {
          field_number = 0;
          goto LAB_0014b258;
        }
LAB_0014b196:
        bVar15 = false;
        ptr_local = (char *)0x0;
      }
    }
    else if ((byte)*puStack_40 == 0x10) {
      uVar12 = (uint)(char)*p_01;
      uVar11 = *p_01 + uVar12;
      uVar13 = uVar12 * 2 & uVar11;
      this_00 = (ExtensionSet *)(ulong)uVar13;
      if ((short)uVar13 < 0) {
        puStack_40 = (ushort *)((long)puStack_40 + 3);
        lVar10 = 0xd;
        pEVar14 = (ExtensionSet *)(ulong)(uVar13 >> 1);
        do {
          this_00 = pEVar14;
          uVar12 = (uint)(char)*puStack_40;
          uVar11 = *puStack_40 + uVar12;
          uVar13 = uVar12 * 2 & uVar11;
          pEVar14 = (ExtensionSet *)
                    ((long)&this_00->arena_ + ((ulong)uVar13 - 2 << ((byte)lVar10 & 0x3f)));
          if (-1 < (short)uVar13) {
            puStack_40 = (ushort *)((long)puStack_40 + (ulong)(uVar11 < uVar12) + 1);
            goto LAB_0014af98;
          }
          lVar10 = lVar10 + 0xe;
          puStack_40 = puStack_40 + 1;
        } while (lVar10 != 0x45);
        puStack_40 = (ushort *)0x0;
        pEVar14 = unaff_R13;
      }
      else {
        puStack_40 = (ushort *)((long)puStack_40 + (ulong)(uVar11 < uVar12) + 2);
        pEVar14 = (ExtensionSet *)(ulong)(uVar13 >> 1);
      }
LAB_0014af98:
      if (puStack_40 == (ushort *)0x0) {
        bVar6 = false;
        ptr_local = (char *)0x0;
      }
      else {
        field_number = (uint)pEVar14;
        if (payload._M_dataplus._M_p == (pointer)0x0) {
          bVar6 = true;
        }
        else {
          local_120 = (undefined1  [8])&PTR__ExtensionFinder_001a4df0;
          tmp_ctx.super_EpsCopyInputStream.limit_end_ = (char *)payload.field_2._8_8_;
          extension_00 = (string *)&tmp_ctx.data_.factory;
          bVar6 = FindExtensionInfoFromFieldNumber
                            (this_00,2,field_number,(ExtensionFinder *)local_120,
                             (ExtensionInfo *)extension_00,&local_41);
          _Var5 = payload._M_dataplus;
          auVar4 = local_80;
          if (bVar6) {
            if (tmp_ctx.data_.factory._1_1_ == '\x01') {
              pMVar8 = AddMessage(this,field_number,'\v',(MessageLite *)extension._0_8_,
                                  (FieldDescriptor *)extension.field_3.enum_validity_check.arg);
            }
            else {
              pMVar8 = MutableMessage(this,field_number,'\v',(MessageLite *)extension._0_8_,
                                      (FieldDescriptor *)extension.field_3.enum_validity_check.arg);
            }
            ParseContext::ParseContext<std::__cxx11::string&>
                      ((ParseContext *)local_120,ctx->depth_,false,(char **)&extension.descriptor,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
            tmp_ctx._88_8_ = (ctx->data_).pool;
            tmp_ctx.data_.pool = (DescriptorPool *)(ctx->data_).factory;
            iVar7 = (*pMVar8->_vptr_MessageLite[0xb])
                              (pMVar8,extension.descriptor,(ParseContext *)local_120);
            bVar15 = CONCAT44(extraout_var,iVar7) != 0;
            bVar6 = (int)tmp_ctx.super_EpsCopyInputStream.aliasing_ == 0 && bVar15;
            if ((int)tmp_ctx.super_EpsCopyInputStream.aliasing_ == 0 && bVar15) {
              field_number = 0;
            }
            else {
              ptr_local = (char *)0x0;
            }
          }
          else {
            if ((long)payload._M_dataplus._M_p < 0) {
              StringPiece::LogFatalSizeTooBig
                        ((size_t)payload._M_dataplus._M_p,"size_t to int conversion");
            }
            if (((ulong)metadata->ptr_ & 1) == 0) {
              pbVar9 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(metadata)
              ;
            }
            else {
              pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (((ulong)metadata->ptr_ & 0xfffffffffffffffe) + 8);
            }
            val.length_ = (stringpiece_ssize_type)pbVar9;
            val.ptr_ = _Var5._M_p;
            WriteLengthDelimited
                      ((internal *)((ulong)pEVar14 & 0xffffffff),auVar4._0_4_,val,extension_00);
            field_number = 0;
            bVar6 = true;
          }
        }
      }
      if (bVar6) {
LAB_0014b258:
        bVar15 = true;
        unaff_R13 = pEVar14;
      }
      else {
        bVar15 = false;
        unaff_R13 = pEVar14;
      }
    }
    else {
      bVar1 = (byte)*puStack_40;
      uVar11 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*(byte *)p_01 * 0x80) - 0x80;
        if ((char)*(byte *)p_01 < '\0') {
          puStack_40 = p_01;
          pVar17 = ReadTagFallback((char *)p_00,res);
          auVar3 = pVar17._0_12_;
        }
        else {
          auVar3._8_4_ = res;
          auVar3._0_8_ = puStack_40 + 1;
        }
        uVar11 = auVar3._8_4_;
        p_01 = auVar3._0_8_;
      }
      puStack_40 = p_01;
      if (uVar11 != 0 && (uVar11 & 7) != 4) {
        puStack_40 = (ushort *)
                     ParseField(this,(ulong)uVar11,(char *)p_01,(MessageLite *)payload.field_2._8_8_
                                ,metadata,ctx);
        if (puStack_40 == (ushort *)0x0) goto LAB_0014b196;
        goto LAB_0014b258;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar11 - 1;
      bVar15 = false;
      ptr_local = (char *)p_01;
    }
  } while (bVar15);
  if (local_80 != (undefined1  [8])&payload._M_string_length) {
    operator_delete((void *)local_80);
  }
  return ptr_local;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* containing_type,
    internal::InternalMetadata* metadata, internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}